

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cc
# Opt level: O3

Symbol __thiscall avro::parsing::Symbol::error(Symbol *this,NodePtr *writer,NodePtr *reader)

{
  ostream *poVar1;
  any extraout_RDX;
  Symbol SVar2;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Cannot resolve: ",0x10);
  std::ios::widen((char)(ostringstream *)local_198 + (char)*(undefined8 *)(local_198[0] + -0x18));
  std::ostream::put((char)local_198);
  std::ostream::flush();
  (*writer->px->_vptr_Node[0xd])(writer->px,local_198,0);
  std::ios::widen((char)local_198 + (char)*(undefined8 *)(local_198[0] + -0x18));
  std::ostream::put((char)local_198);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"with",4);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  (*reader->px->_vptr_Node[0xd])(reader->px,local_198,0);
  std::__cxx11::stringbuf::str();
  this->kind_ = sError;
  boost::any::any<std::__cxx11::string&>(&this->extra_,&local_1b8,(type *)0x0,(type *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  SVar2.extra_.content = extraout_RDX.content;
  SVar2._0_8_ = this;
  return SVar2;
}

Assistant:

Symbol Symbol::error(const NodePtr& writer, const NodePtr& reader)
{
    ostringstream oss;
    oss << "Cannot resolve: " << std::endl;
    writer->printJson(oss, 0);
    oss << std::endl << "with" << std::endl;
    reader->printJson(oss, 0);
    return Symbol(sError, oss.str());
}